

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_lmb.cpp
# Opt level: O0

size_t LMBCSConvertUni(ulmbcs_byte_t *pLMBCS,UChar uniChar)

{
  ulmbcs_byte_t uVar1;
  uint8_t HighCh;
  uint8_t LowCh;
  UChar uniChar_local;
  ulmbcs_byte_t *pLMBCS_local;
  
  uVar1 = (ulmbcs_byte_t)((ushort)uniChar >> 8);
  *pLMBCS = '\x14';
  if ((ulmbcs_byte_t)uniChar == '\0') {
    pLMBCS[1] = 0xf6;
    pLMBCS[2] = uVar1;
  }
  else {
    pLMBCS[1] = uVar1;
    pLMBCS[2] = (ulmbcs_byte_t)uniChar;
  }
  return 3;
}

Assistant:

static size_t 
LMBCSConvertUni(ulmbcs_byte_t * pLMBCS, UChar uniChar)  
{
     /* encode into LMBCS Unicode range */
   uint8_t LowCh =   (uint8_t)(uniChar & 0x00FF);
   uint8_t HighCh  = (uint8_t)(uniChar >> 8);

   *pLMBCS++ = ULMBCS_GRP_UNICODE;

   if (LowCh == 0)
   {
      *pLMBCS++ = ULMBCS_UNICOMPATZERO;
      *pLMBCS++ = HighCh;
   }
   else
   {
      *pLMBCS++ = HighCh;
      *pLMBCS++ = LowCh;
   }
   return ULMBCS_UNICODE_SIZE;
}